

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O2

int __thiscall PlatformWindowData::rename(PlatformWindowData *this,char *__old,char *__new)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 unaff_RBP;
  char *__s;
  string title2;
  
  to_utf8_string(&title2,(wstring *)__old);
  lVar1 = XInternAtom(this->display,"_NET_WM_NAME",1);
  lVar2 = XInternAtom(this->display,"UTF8_STRING",1);
  if (lVar1 == 0) {
    __s = "_NET_WM_NAME not found. Window title was not set.";
  }
  else {
    if (lVar2 != 0) {
      XChangeProperty(this->display,this->handle,lVar1,lVar2,8,0,title2._M_dataplus._M_p,
                      (undefined4)title2._M_string_length);
      iVar3 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      std::__cxx11::wstring::_M_assign((wstring *)&this->title);
      goto LAB_00112bf3;
    }
    __s = "UTF8_STRING not found. Window title was not set.";
  }
  puts(__s);
  iVar3 = 0;
LAB_00112bf3:
  std::__cxx11::string::~string((string *)&title2);
  return iVar3;
}

Assistant:

bool rename(std::wstring const& name)
	{
		auto title2 = to_utf8_string(name);
		Atom wmname = XInternAtom(display, "_NET_WM_NAME", True);
		Atom utf8str = XInternAtom(display, "UTF8_STRING", True);
		if(wmname == None){ printf("_NET_WM_NAME not found. Window title was not set.\n"); }
		else
		{
			if(utf8str == None){ printf("UTF8_STRING not found. Window title was not set.\n"); }
			else
			{
				XChangeProperty(display, handle, wmname, utf8str, 8, PropModeReplace, (const unsigned char*)title2.c_str(), title2.size());
				title = name;
				return true;
			}
		}
		return false;
	}